

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary_unix.cpp
# Opt level: O2

bool __thiscall QLibraryPrivate::unload_sys(QLibraryPrivate *this)

{
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  int iVar4;
  storage_type *psVar5;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView local_88;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  char *error;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = dlclose((this->pHnd).super_QBasicAtomicPointer<void>._q_value._M_b._M_p);
  if (iVar4 == 0) {
    QString::clear(&this->errorString);
  }
  else {
    error = (char *)dlerror();
    psVar5 = (storage_type *)0xffffffffffffffff;
    QLibrary::tr((QString *)&local_60,"Cannot unload library %1: %2",(char *)0x0,-1);
    QByteArrayView::QByteArrayView<const_char_*,_true>(&local_88,&error);
    ba.m_data = psVar5;
    ba.m_size = (qsizetype)local_88.m_data;
    QString::fromLocal8Bit((QString *)&local_78,(QString *)local_88.m_size,ba);
    QString::arg<QString_const&,QString>
              ((type *)&local_48,(QString *)&local_60,&this->fileName,(QString *)&local_78);
    pDVar2 = (this->errorString).d.d;
    pcVar3 = (this->errorString).d.ptr;
    (this->errorString).d.d = local_48.d;
    (this->errorString).d.ptr = local_48.ptr;
    qVar1 = (this->errorString).d.size;
    (this->errorString).d.size = local_48.size;
    local_48.d = pDVar2;
    local_48.ptr = pcVar3;
    local_48.size = qVar1;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar4 == 0;
  }
  __stack_chk_fail();
}

Assistant:

bool QLibraryPrivate::unload_sys()
{
    bool doTryUnload = true;
#ifndef RTLD_NODELETE
    if (loadHints() & QLibrary::PreventUnloadHint)
        doTryUnload = false;
#endif
    if (doTryUnload && dlclose(pHnd.loadAcquire())) {
        const char *error = dlerror();
#if defined (Q_OS_QNX)
        // Workaround until fixed in QNX; fixes crash in
        // QtDeclarative auto test "qqmlenginecleanup" for instance
        if (!qstrcmp(error, "Shared objects still referenced")) // On QNX that's only "informative"
            return true;
#endif
        errorString = QLibrary::tr("Cannot unload library %1: %2")
                .arg(fileName, QString::fromLocal8Bit(error));
        return false;
    }
    errorString.clear();
    return true;
}